

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall
asmjit::BaseBuilder::_newCommentNode(BaseBuilder *this,CommentNode **out,char *data,size_t size)

{
  int iVar1;
  Error EVar2;
  undefined4 extraout_var;
  char *data_local;
  
  *out = (CommentNode *)0x0;
  data_local = data;
  if (data != (char *)0x0) {
    if (size == 0xffffffffffffffff) {
      size = strlen(data);
    }
    if (size != 0) {
      iVar1 = Zone::dup(&this->_dataZone,(int)data);
      data_local = (char *)CONCAT44(extraout_var,iVar1);
      if (data_local == (char *)0x0) {
        EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
        return EVar2;
      }
    }
  }
  EVar2 = _newNodeT<asmjit::CommentNode,char_const*&>(this,out,&data_local);
  return EVar2;
}

Assistant:

Error BaseBuilder::_newCommentNode(CommentNode** out, const char* data, size_t size) {
  *out = nullptr;

  if (data) {
    if (size == SIZE_MAX)
      size = strlen(data);

    if (size > 0) {
      data = static_cast<char*>(_dataZone.dup(data, size, true));
      if (ASMJIT_UNLIKELY(!data))
        return reportError(DebugUtils::errored(kErrorOutOfMemory));
    }
  }

  return _newNodeT<CommentNode>(out, data);
}